

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall
TSMuxer::setMasterMode(TSMuxer *this,AbstractMuxer *subMuxer,bool flushInterleavedBlock)

{
  pointer pvVar1;
  iterator __position;
  uint in_EAX;
  undefined8 uStack_8;
  
  if ((subMuxer == (AbstractMuxer *)0x0) ||
     (in_EAX = 0x242648, subMuxer->_vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_00242648)) {
    subMuxer = (AbstractMuxer *)0x0;
  }
  this->m_sublingMuxer = (TSMuxer *)subMuxer;
  this->m_masterMode = true;
  this->m_canSwithBlock = flushInterleavedBlock;
  pvVar1 = (this->m_interleaveInfo).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uStack_8 = (ulong)in_EAX;
  __position._M_current =
       pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (pvVar1 + -1,__position,(int *)((long)&uStack_8 + 4));
  }
  else {
    *__position._M_current = 0;
    pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void TSMuxer::setMasterMode(AbstractMuxer* subMuxer, const bool flushInterleavedBlock)
{
    m_sublingMuxer = dynamic_cast<TSMuxer*>(subMuxer);
    m_masterMode = true;
    m_canSwithBlock = flushInterleavedBlock;
    m_interleaveInfo.rbegin()->push_back(0);
}